

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_8.c
# Opt level: O3

parasail_result_t *
parasail_sw_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  void *pvVar1;
  parasail_matrix_t *ppVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  __m256i c;
  __m256i c_00;
  int iVar6;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar7;
  __m256i *palVar8;
  __m256i *b_00;
  ulong uVar9;
  ulong uVar10;
  char cVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  __m256i *ptr;
  __m256i *palVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined8 in_stack_ffffffffffffff18;
  uint uVar35;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar36;
  undefined1 auVar22 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_striped_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar1 = (profile->profile8).score;
    if (pvVar1 == (void *)0x0) {
      parasail_sw_striped_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar2 = profile->matrix;
      if (ppVar2 == (parasail_matrix_t *)0x0) {
        parasail_sw_striped_profile_avx2_256_8_cold_6();
      }
      else {
        uVar13 = profile->s1Len;
        if ((int)uVar13 < 1) {
          parasail_sw_striped_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_striped_profile_avx2_256_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_striped_profile_avx2_256_8_cold_3();
        }
        else if (open < 0) {
          parasail_sw_striped_profile_avx2_256_8_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_striped_profile_avx2_256_8_cold_1();
        }
        else {
          iVar6 = ppVar2->max;
          result = parasail_result_new();
          if (result != (parasail_result_t *)0x0) {
            uVar9 = (ulong)uVar13 + 0x1f;
            uVar10 = uVar9 >> 5;
            result->flag = result->flag | 0x20100804;
            b = parasail_memalign___m256i(0x20,uVar10);
            palVar7 = parasail_memalign___m256i(0x20,uVar10);
            palVar8 = parasail_memalign___m256i(0x20,uVar10);
            b_00 = parasail_memalign___m256i(0x20,uVar10);
            if ((b_00 != (__m256i *)0x0 && palVar8 != (__m256i *)0x0) &&
                (palVar7 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
              iVar14 = 0;
              uVar36 = 0;
              uVar19 = (undefined1)open;
              uVar20 = (undefined1)gap;
              c[1]._0_4_ = iVar6;
              c[0] = in_stack_ffffffffffffff18;
              c[1]._4_4_ = in_stack_ffffffffffffff24;
              c[2] = (longlong)result;
              c[3] = 0;
              parasail_memset___m256i(b,c,uVar10);
              c_00[1]._0_4_ = iVar6;
              c_00[0] = in_stack_ffffffffffffff18;
              c_00[1]._4_4_ = in_stack_ffffffffffffff24;
              c_00[2] = (longlong)result;
              c_00[3]._0_4_ = iVar14;
              c_00[3]._4_4_ = uVar36;
              parasail_memset___m256i(b_00,c_00,uVar10);
              auVar3[1] = uVar20;
              auVar3[0] = uVar20;
              auVar3[2] = uVar20;
              auVar3[3] = uVar20;
              auVar3[4] = uVar20;
              auVar3[5] = uVar20;
              auVar3[6] = uVar20;
              auVar3[7] = uVar20;
              auVar3[8] = uVar20;
              auVar3[9] = uVar20;
              auVar3[10] = uVar20;
              auVar3[0xb] = uVar20;
              auVar3[0xc] = uVar20;
              auVar3[0xd] = uVar20;
              auVar3[0xe] = uVar20;
              auVar3[0xf] = uVar20;
              auVar3[0x10] = uVar20;
              auVar3[0x11] = uVar20;
              auVar3[0x12] = uVar20;
              auVar3[0x13] = uVar20;
              auVar3[0x14] = uVar20;
              auVar3[0x15] = uVar20;
              auVar3[0x16] = uVar20;
              auVar3[0x17] = uVar20;
              auVar3[0x18] = uVar20;
              auVar3[0x19] = uVar20;
              auVar3[0x1a] = uVar20;
              auVar3[0x1b] = uVar20;
              auVar3[0x1c] = uVar20;
              auVar3[0x1d] = uVar20;
              auVar3[0x1e] = uVar20;
              auVar3[0x1f] = uVar20;
              auVar4[1] = uVar19;
              auVar4[0] = uVar19;
              auVar4[2] = uVar19;
              auVar4[3] = uVar19;
              auVar4[4] = uVar19;
              auVar4[5] = uVar19;
              auVar4[6] = uVar19;
              auVar4[7] = uVar19;
              auVar4[8] = uVar19;
              auVar4[9] = uVar19;
              auVar4[10] = uVar19;
              auVar4[0xb] = uVar19;
              auVar4[0xc] = uVar19;
              auVar4[0xd] = uVar19;
              auVar4[0xe] = uVar19;
              auVar4[0xf] = uVar19;
              auVar4[0x10] = uVar19;
              auVar4[0x11] = uVar19;
              auVar4[0x12] = uVar19;
              auVar4[0x13] = uVar19;
              auVar4[0x14] = uVar19;
              auVar4[0x15] = uVar19;
              auVar4[0x16] = uVar19;
              auVar4[0x17] = uVar19;
              auVar4[0x18] = uVar19;
              auVar4[0x19] = uVar19;
              auVar4[0x1a] = uVar19;
              auVar4[0x1b] = uVar19;
              auVar4[0x1c] = uVar19;
              auVar4[0x1d] = uVar19;
              auVar4[0x1e] = uVar19;
              auVar4[0x1f] = uVar19;
              uVar35 = (uint)uVar10;
              cVar11 = -0x80;
              auVar21[8] = 0x80;
              auVar21._0_8_ = 0x8080808080808080;
              auVar21[9] = 0x80;
              auVar21[10] = 0x80;
              auVar21[0xb] = 0x80;
              auVar21[0xc] = 0x80;
              auVar21[0xd] = 0x80;
              auVar21[0xe] = 0x80;
              auVar21[0xf] = 0x80;
              auVar22[0x10] = 0x80;
              auVar22._0_16_ = auVar21;
              auVar22[0x11] = 0x80;
              auVar22[0x12] = 0x80;
              auVar22[0x13] = 0x80;
              auVar22[0x14] = 0x80;
              auVar22[0x15] = 0x80;
              auVar22[0x16] = 0x80;
              auVar22[0x17] = 0x80;
              auVar22[0x18] = 0x80;
              auVar22[0x19] = 0x80;
              auVar22[0x1a] = 0x80;
              auVar22[0x1b] = 0x80;
              auVar22[0x1c] = 0x80;
              auVar22[0x1d] = 0x80;
              auVar22[0x1e] = 0x80;
              auVar22[0x1f] = 0x80;
              uVar15 = 0;
              auVar27 = ZEXT3264(auVar22);
              auVar25 = ZEXT3264(auVar22);
              do {
                ptr = b;
                iVar16 = ppVar2->mapper[(byte)s2[uVar15]];
                iVar5 = (int)uVar15;
                palVar18 = palVar8;
                b = palVar7;
                if (iVar14 == iVar5 + -2) {
                  palVar18 = palVar7;
                  b = palVar8;
                }
                auVar24 = SUB3216(ptr[uVar35 - 1],0);
                auVar34._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar21;
                auVar34._16_16_ = ZEXT116(0) * auVar22._16_16_ + ZEXT116(1) * auVar24;
                auVar34 = vpalignr_avx2((undefined1  [32])ptr[uVar35 - 1],auVar34,0xf);
                auVar24 = vpinsrb_avx(auVar34._0_16_,0x80,0);
                auVar34 = vpblendd_avx2(auVar34,ZEXT1632(auVar24),0xf);
                lVar17 = 0;
                auVar30 = ZEXT3264(auVar22);
                do {
                  auVar28 = vpaddsb_avx2(auVar34,*(undefined1 (*) [32])
                                                  ((long)pvVar1 +
                                                  lVar17 + (long)iVar16 * uVar10 * 0x20));
                  auVar34 = *(undefined1 (*) [32])((long)*b_00 + lVar17);
                  auVar29 = vpmaxsb_avx2(auVar34,auVar30._0_32_);
                  auVar28 = vpmaxsb_avx2(auVar28,auVar29);
                  *(undefined1 (*) [32])((long)*b + lVar17) = auVar28;
                  auVar29 = vpmaxsb_avx2(auVar28,auVar25._0_32_);
                  auVar25 = ZEXT3264(auVar29);
                  auVar28 = vpsubsb_avx2(auVar28,auVar4);
                  auVar34 = vpsubsb_avx2(auVar34,auVar3);
                  auVar34 = vpmaxsb_avx2(auVar34,auVar28);
                  *(undefined1 (*) [32])((long)*b_00 + lVar17) = auVar34;
                  auVar34 = vpsubsb_avx2(auVar30._0_32_,auVar3);
                  auVar34 = vpmaxsb_avx2(auVar34,auVar28);
                  auVar30 = ZEXT3264(auVar34);
                  auVar34 = *(undefined1 (*) [32])((long)*ptr + lVar17);
                  lVar17 = lVar17 + 0x20;
                } while (uVar10 << 5 != lVar17);
                iVar16 = 0;
                do {
                  auVar28._0_16_ = ZEXT116(0) * auVar30._0_16_ + ZEXT116(1) * auVar21;
                  auVar28._16_16_ = ZEXT116(0) * auVar22._16_16_ + ZEXT116(1) * auVar30._0_16_;
                  auVar34 = vpalignr_avx2(auVar30._0_32_,auVar28,0xf);
                  auVar24 = vpinsrb_avx(auVar34._0_16_,0x80,0);
                  auVar34 = vpblendd_avx2(auVar34,ZEXT1632(auVar24),0xf);
                  auVar30 = ZEXT3264(auVar34);
                  lVar17 = 0;
                  do {
                    auVar34 = vpmaxsb_avx2(auVar30._0_32_,*(undefined1 (*) [32])((long)*b + lVar17))
                    ;
                    *(undefined1 (*) [32])((long)*b + lVar17) = auVar34;
                    auVar28 = vpmaxsb_avx2(auVar34,auVar25._0_32_);
                    auVar25 = ZEXT3264(auVar28);
                    auVar34 = vpsubsb_avx2(auVar34,auVar4);
                    auVar29 = vpsubsb_avx2(auVar30._0_32_,auVar3);
                    auVar30 = ZEXT3264(auVar29);
                    auVar34 = vpcmpgtb_avx2(auVar29,auVar34);
                    if ((((((((((((((((((((((((((((((((auVar34 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar34 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar34 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar34 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar34 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar34 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar34 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar34 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar34 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar34 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar34 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar34 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar34 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar34 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar34 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar34 >> 0x7f,0) == '\0')
                                      && (auVar34 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar34 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar34 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar34 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar34 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar34 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar34 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar34 >> 0xbf,0) == '\0') &&
                              (auVar34 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar34 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar34 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar34 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar34 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar34 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar34 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar34[0x1f]) goto LAB_00779fbb;
                    lVar17 = lVar17 + 0x20;
                  } while (uVar10 << 5 != lVar17);
                  iVar16 = iVar16 + 1;
                } while (iVar16 != 0x20);
LAB_00779fbb:
                auVar34 = vpcmpgtb_avx2(auVar28,auVar27._0_32_);
                if ((((((((((((((((((((((((((((((((auVar34 >> 7 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0 ||
                                                 (auVar34 >> 0xf & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar34 >> 0x17 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar34 >> 0x1f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar34 >> 0x27 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar34 >> 0x2f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar34 >> 0x37 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar34 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar34 >> 0x47 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar34 >> 0x4f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar34 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar34 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar34 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar34 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar34 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar34 >> 0x7f,0) != '\0') ||
                                  (auVar34 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar34 >> 0x8f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar34 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar34 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar34 >> 0xa7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar34 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar34 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar34 >> 0xbf,0) != '\0') ||
                          (auVar34 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar34 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar34 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar34 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar34 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar34 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar34 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    auVar34[0x1f] < '\0') {
                  auVar34 = vpermq_avx2(auVar28,0x44);
                  auVar34 = vpmaxsb_avx2(auVar28,auVar34);
                  auVar28 = vpslldq_avx2(auVar34,8);
                  auVar34 = vpmaxsb_avx2(auVar34,auVar28);
                  auVar28 = vpslldq_avx2(auVar34,4);
                  auVar34 = vpmaxsb_avx2(auVar34,auVar28);
                  auVar28 = vpslldq_avx2(auVar34,2);
                  auVar34 = vpmaxsb_avx2(auVar34,auVar28);
                  auVar28 = vpslldq_avx2(auVar34,1);
                  auVar34 = vpmaxsb_avx2(auVar34,auVar28);
                  cVar11 = auVar34[0x17];
                  if ((char)('~' - (char)iVar6) < cVar11) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    s2Len = iVar5;
                    break;
                  }
                  auVar29[8] = 0xf;
                  auVar29._0_8_ = 0xf0f0f0f0f0f0f0f;
                  auVar29[9] = 0xf;
                  auVar29[10] = 0xf;
                  auVar29[0xb] = 0xf;
                  auVar29[0xc] = 0xf;
                  auVar29[0xd] = 0xf;
                  auVar29[0xe] = 0xf;
                  auVar29[0xf] = 0xf;
                  auVar29[0x10] = 0xf;
                  auVar29[0x11] = 0xf;
                  auVar29[0x12] = 0xf;
                  auVar29[0x13] = 0xf;
                  auVar29[0x14] = 0xf;
                  auVar29[0x15] = 0xf;
                  auVar29[0x16] = 0xf;
                  auVar29[0x17] = 0xf;
                  auVar29[0x18] = 0xf;
                  auVar29[0x19] = 0xf;
                  auVar29[0x1a] = 0xf;
                  auVar29[0x1b] = 0xf;
                  auVar29[0x1c] = 0xf;
                  auVar29[0x1d] = 0xf;
                  auVar29[0x1e] = 0xf;
                  auVar29[0x1f] = 0xf;
                  auVar34 = vpshufb_avx2(auVar34,auVar29);
                  auVar34 = vpermq_avx2(auVar34,0xaa);
                  auVar27 = ZEXT3264(auVar34);
                  iVar14 = iVar5;
                }
                uVar15 = uVar15 + 1;
                palVar7 = ptr;
                palVar8 = palVar18;
              } while (uVar15 != (uint)s2Len);
              if (cVar11 == '\x7f') {
                *(byte *)&result->flag = (byte)result->flag | 0x40;
              }
              iVar6 = parasail_result_is_saturated(result);
              palVar7 = palVar18;
              if (iVar6 == 0) {
                palVar8 = ptr;
                if (iVar14 == s2Len + -2) {
                  palVar7 = ptr;
                  palVar8 = palVar18;
                }
                if (iVar14 == s2Len + -1) {
                  palVar7 = b;
                  b = palVar18;
                  palVar8 = ptr;
                }
                ptr = palVar8;
                uVar13 = uVar13 - 1;
                if ((uVar9 & 0x7fffffe0) != 0) {
                  if ((uVar9 & 0x7fffffe0) == 0) {
                    uVar9 = 0;
                    do {
                      if ((*(char *)((long)*palVar7 + uVar9) == cVar11) &&
                         (uVar12 = ((uint)uVar9 & 0x1f) * uVar35 | (uint)(uVar9 >> 5) & 0x7ffffff,
                         (int)uVar12 < (int)uVar13)) {
                        uVar13 = uVar12;
                      }
                      uVar9 = uVar9 + 1;
                    } while ((uVar35 & 0x3ffffff) << 5 != (int)uVar9);
                  }
                  else {
                    auVar23._4_4_ = uVar13;
                    auVar23._0_4_ = uVar13;
                    auVar23._8_4_ = uVar13;
                    auVar23._12_4_ = uVar13;
                    auVar23._16_4_ = uVar13;
                    auVar23._20_4_ = uVar13;
                    auVar23._24_4_ = uVar13;
                    auVar23._28_4_ = uVar13;
                    auVar24[1] = cVar11;
                    auVar24[0] = cVar11;
                    auVar24[2] = cVar11;
                    auVar24[3] = cVar11;
                    auVar24[4] = cVar11;
                    auVar24[5] = cVar11;
                    auVar24[6] = cVar11;
                    auVar24[7] = cVar11;
                    auVar24[8] = cVar11;
                    auVar24[9] = cVar11;
                    auVar24[10] = cVar11;
                    auVar24[0xb] = cVar11;
                    auVar24[0xc] = cVar11;
                    auVar24[0xd] = cVar11;
                    auVar24[0xe] = cVar11;
                    auVar24[0xf] = cVar11;
                    auVar26._4_4_ = uVar35;
                    auVar26._0_4_ = uVar35;
                    auVar26._8_4_ = uVar35;
                    auVar26._12_4_ = uVar35;
                    auVar26._16_4_ = uVar35;
                    auVar26._20_4_ = uVar35;
                    auVar26._24_4_ = uVar35;
                    auVar26._28_4_ = uVar35;
                    auVar4 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
                    uVar10 = 0;
                    auVar31._8_4_ = 0x1f;
                    auVar31._0_8_ = 0x1f0000001f;
                    auVar31._12_4_ = 0x1f;
                    auVar31._16_4_ = 0x1f;
                    auVar31._20_4_ = 0x1f;
                    auVar31._24_4_ = 0x1f;
                    auVar31._28_4_ = 0x1f;
                    auVar32._8_4_ = 8;
                    auVar32._0_8_ = 0x800000008;
                    auVar32._12_4_ = 8;
                    auVar32._16_4_ = 8;
                    auVar32._20_4_ = 8;
                    auVar32._24_4_ = 8;
                    auVar32._28_4_ = 8;
                    do {
                      auVar33._8_8_ = 0;
                      auVar33._0_8_ = *(ulong *)((long)*palVar7 + uVar10);
                      auVar21 = vpcmpeqb_avx(auVar33,auVar24);
                      auVar22 = vpmovsxbd_avx2(auVar21);
                      auVar34 = vpsrld_avx2(auVar4,5);
                      auVar3 = vpand_avx2(auVar4,auVar31);
                      auVar3 = vpmulld_avx2(auVar3,auVar26);
                      auVar3 = vpaddd_avx2(auVar3,auVar34);
                      auVar3 = vpminsd_avx2(auVar3,auVar23);
                      auVar23 = vblendvps_avx(auVar23,auVar3,auVar22);
                      uVar10 = uVar10 + 8;
                      auVar4 = vpaddd_avx2(auVar4,auVar32);
                    } while (((uint)uVar9 & 0x7fffffe0) != uVar10);
                    auVar21 = vpminsd_avx(auVar23._0_16_,auVar23._16_16_);
                    auVar24 = vpshufd_avx(auVar21,0xee);
                    auVar21 = vpminsd_avx(auVar21,auVar24);
                    auVar24 = vpshufd_avx(auVar21,0x55);
                    auVar21 = vpminsd_avx(auVar21,auVar24);
                    uVar13 = auVar21._0_4_;
                  }
                }
                iVar6 = cVar11 + 0x80;
              }
              else {
                iVar14 = 0;
                iVar6 = 0xff;
                uVar13 = 0;
              }
              result->score = iVar6;
              result->end_query = uVar13;
              result->end_ref = iVar14;
              parasail_free(b_00);
              parasail_free(palVar7);
              parasail_free(ptr);
              parasail_free(b);
              return result;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    int8_t bias = 0;
    int8_t score = 0;
    __m256i vBias;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int8_t maxp = 0;
    __m256i insert_mask;
    /*int8_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    vZero = _mm256_set1_epi8(0);
    bias = INT8_MIN;
    score = bias;
    vBias = _mm256_set1_epi8(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT8_MAX - (int8_t)(matrix->max+1);
    insert_mask = _mm256_cmpgt_epi8(
            _mm256_set_epi8(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT8_MAX : (int8_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi8(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi8(vH, vMaxH);
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi8(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi8_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi8(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT8_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT8_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int8_t *t = (int8_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}